

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usda-reader.cc
# Opt level: O3

bool __thiscall
tinyusdz::usda::USDAReader::Impl::ReconstructPrim<tinyusdz::Shader>
          (Impl *this,Specifier *spec,PropertyMap *properties,ReferenceList *references,Shader *prim
          )

{
  bool bVar1;
  ostream *poVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *warn;
  string err;
  ostringstream ss_e;
  PrimReconstructOptions local_229;
  string local_228;
  long *local_208 [2];
  long local_1f8 [2];
  string local_1e8;
  string local_1c8;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  local_229.strict_allowedToken_check = (this->_config).strict_allowedToken_check;
  local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
  local_228._M_string_length = 0;
  local_228.field_2._M_local_buf[0] = '\0';
  warn = &this->_warn;
  bVar1 = tinyusdz::prim::ReconstructPrim<tinyusdz::Shader>
                    (spec,properties,references,prim,warn,&local_228,&local_229);
  if (!bVar1) {
    ::std::__cxx11::ostringstream::ostringstream(local_1a8);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usda-reader.cc"
               ,0x55);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"ReconstructPrim",0xf)
    ;
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
    poVar2 = (ostream *)::std::ostream::operator<<(local_1a8,0x657);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
    local_208[0] = local_1f8;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_208,"Failed to reconstruct {} Prim: {}","");
    local_1c8.field_2._M_allocated_capacity._0_4_ = 0x64616853;
    local_1c8.field_2._M_allocated_capacity._4_2_ = 0x7265;
    local_1c8._M_string_length = 6;
    local_1c8.field_2._M_local_buf[6] = '\0';
    local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
    fmt::format<std::__cxx11::string,std::__cxx11::string>
              (&local_1e8,(fmt *)local_208,&local_1c8,&local_228,warn);
    poVar2 = ::std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,local_1e8._M_dataplus._M_p,local_1e8._M_string_length);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
      operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
      operator_delete(local_1c8._M_dataplus._M_p,
                      CONCAT17(local_1c8.field_2._M_local_buf[7],
                               CONCAT16(local_1c8.field_2._M_local_buf[6],
                                        CONCAT24(local_1c8.field_2._M_allocated_capacity._4_2_,
                                                 local_1c8.field_2._M_allocated_capacity._0_4_))) +
                      1);
    }
    if (local_208[0] != local_1f8) {
      operator_delete(local_208[0],local_1f8[0] + 1);
    }
    ::std::__cxx11::stringbuf::str();
    ::std::__cxx11::string::_M_append((char *)&this->_err,(ulong)local_1e8._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
      operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
    }
    ::std::__cxx11::ostringstream::~ostringstream(local_1a8);
    ::std::ios_base::~ios_base(local_138);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != &local_228.field_2) {
    operator_delete(local_228._M_dataplus._M_p,
                    CONCAT71(local_228.field_2._M_allocated_capacity._1_7_,
                             local_228.field_2._M_local_buf[0]) + 1);
  }
  return bVar1;
}

Assistant:

bool USDAReader::Impl::ReconstructPrim(
    const Specifier &spec,
    const prim::PropertyMap &properties,
    const prim::ReferenceList &references,
    T *prim) {

  prim::PrimReconstructOptions options;
  options.strict_allowedToken_check = _config.strict_allowedToken_check;
  DCOUT("strict_allowedToken_check " << options.strict_allowedToken_check);

  std::string err;
  if (!prim::ReconstructPrim(spec, properties, references, prim, &_warn, &err, options)) {
    PUSH_ERROR_AND_RETURN(fmt::format("Failed to reconstruct {} Prim: {}", value::TypeTraits<T>::type_name(), err));
  }
  return true;
}